

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  bool bVar1;
  ulong uVar2;
  XmlWriter *this_00;
  string *text;
  reference pPVar3;
  string *in_RCX;
  string *in_RDX;
  JunitReporter *in_RSI;
  long in_RDI;
  const_iterator itEnd;
  const_iterator it;
  ScopedElement e;
  string name;
  JunitReporter *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  SectionNode *in_stack_fffffffffffffcf8;
  JunitReporter *in_stack_fffffffffffffd00;
  allocator *this_01;
  string *in_stack_fffffffffffffd10;
  XmlWriter *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd28;
  undefined1 local_279 [33];
  Ptr<Catch::CumulativeReporterBase::SectionNode> *local_258;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_250;
  string local_248 [39];
  allocator local_221;
  string local_220 [40];
  string local_1f8 [39];
  undefined1 local_1d1 [41];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [56];
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  SectionNode *in_stack_ffffffffffffffd8;
  JunitReporter *this_02;
  
  trim(in_stack_fffffffffffffd28);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  bVar1 = std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)
                     in_stack_fffffffffffffd00);
  if (((!bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"testcase",&local_b9);
    XmlWriter::scopedElement(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"classname",&local_131);
      XmlWriter::writeAttribute
                ((XmlWriter *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      in_stack_fffffffffffffd28 = (string *)(in_RDI + 0xc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"name",&local_159);
      XmlWriter::writeAttribute
                ((XmlWriter *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"classname",&local_e1);
      XmlWriter::writeAttribute
                ((XmlWriter *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"name",&local_109);
      XmlWriter::writeAttribute<char[5]>
                ((XmlWriter *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                 (char (*) [5])in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    this_00 = (XmlWriter *)(in_RDI + 0xc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"time",&local_181);
    Catch::toString_abi_cxx11_((double)in_stack_fffffffffffffce8);
    XmlWriter::writeAttribute
              ((XmlWriter *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    writeAssertions(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffd10 = (string *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1d1 + 1),"system-out",(allocator *)in_stack_fffffffffffffd10);
      XmlWriter::scopedElement(this_00,in_stack_fffffffffffffd10);
      trim(in_stack_fffffffffffffd28);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                 SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
      std::__cxx11::string::~string(local_1f8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      text = (string *)(in_RDI + 0xc0);
      this_01 = &local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"system-err",this_01);
      XmlWriter::scopedElement(this_00,in_stack_fffffffffffffd10);
      trim(in_stack_fffffffffffffd28);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)this_01,text,SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
      std::__cxx11::string::~string(local_248);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffcf0);
  }
  local_250._M_current =
       (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
       std::
       vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ::begin((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)in_stack_fffffffffffffce8);
  local_258 = (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
              std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                     *)in_stack_fffffffffffffce8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffce8), bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_02 = in_RSI;
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
               ::operator*(&local_250);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(pPVar3);
      writeSection(this_02,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      in_stack_fffffffffffffce8 = in_RSI;
      in_RSI = this_02;
    }
    else {
      in_stack_fffffffffffffcf0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_279 + 1),"",(allocator *)in_stack_fffffffffffffcf0);
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
               ::operator*(&local_250);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(pPVar3);
      writeSection(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::__cxx11::string::~string((string *)(local_279 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_279);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&local_250);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void writeSection(  std::string const& className,
                            std::string const& rootName,
                            SectionNode const& sectionNode ) {
            std::string name = trim( sectionNode.stats.sectionInfo.name );
            if( !rootName.empty() )
                name = rootName + "/" + name;

            if( !sectionNode.assertions.empty() ||
                !sectionNode.stdOut.empty() ||
                !sectionNode.stdErr.empty() ) {
                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                if( className.empty() ) {
                    xml.writeAttribute( "classname", name );
                    xml.writeAttribute( "name", "root" );
                }
                else {
                    xml.writeAttribute( "classname", className );
                    xml.writeAttribute( "name", name );
                }
                xml.writeAttribute( "time", Catch::toString( sectionNode.stats.durationInSeconds ) );

                writeAssertions( sectionNode );

                if( !sectionNode.stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
                if( !sectionNode.stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
            }
            for( SectionNode::ChildSections::const_iterator
                    it = sectionNode.childSections.begin(),
                    itEnd = sectionNode.childSections.end();
                    it != itEnd;
                    ++it )
                if( className.empty() )
                    writeSection( name, "", **it );
                else
                    writeSection( className, name, **it );
        }